

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack7_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar1 = *(undefined1 (*) [16])in;
  auVar6 = vpmovsxbd_avx512f(_DAT_001a0480);
  auVar9._8_8_ = *(undefined8 *)(in + 2);
  auVar9._0_8_ = *(undefined8 *)(in + 2);
  auVar7 = vpbroadcastd_avx512f(ZEXT416(0x7f));
  uVar2 = in[1];
  auVar8 = vbroadcasti64x4_avx512f(_DAT_00194040);
  uVar3 = in[5];
  auVar9 = vpsllvd_avx2(auVar9,_DAT_001a0420);
  auVar5._8_8_ = 0x600000007e;
  auVar5._0_8_ = 0x600000007e;
  auVar5 = vpandq_avx512vl(auVar9,auVar5);
  *out = *in & 0x7f;
  uVar4 = in[4];
  auVar6 = vpermd_avx512f(auVar6,ZEXT1664(auVar1));
  auVar6 = vpsrlvd_avx512f(auVar6,_DAT_001aff80);
  auVar9 = vpshufd_avx(auVar1,0xff);
  auVar10 = auVar7._0_16_;
  auVar1 = vpinsrd_avx(auVar10,(uVar2 & 7) << 4,3);
  auVar8 = vpermi2d_avx512f(auVar8,ZEXT1664(auVar5),ZEXT1664(auVar1));
  auVar1 = vpinsrd_avx(auVar9,uVar4,1);
  auVar1 = vpshufd_avx(auVar1,0x50);
  auVar5 = vpsrlvd_avx2(auVar1,_DAT_001adde0);
  auVar7 = vpandd_avx512f(auVar6,auVar7);
  auVar6 = vpord_avx512f(auVar6,auVar8);
  auVar8._0_12_ = auVar7._0_12_;
  auVar8._12_4_ = auVar6._12_4_;
  auVar8._16_4_ = auVar7._16_4_;
  auVar8._20_4_ = auVar7._20_4_;
  auVar8._24_4_ = auVar7._24_4_;
  auVar8._28_4_ = auVar7._28_4_;
  auVar8._32_4_ = auVar6._32_4_;
  auVar8._36_4_ = auVar7._36_4_;
  auVar8._40_4_ = auVar7._40_4_;
  auVar8._44_4_ = auVar7._44_4_;
  auVar8._48_4_ = auVar6._48_4_;
  auVar8._52_4_ = auVar7._52_4_;
  auVar8._56_4_ = auVar7._56_4_;
  auVar8._60_4_ = auVar7._60_4_;
  auVar9 = vpinsrd_avx(auVar10,uVar4 * 4 & 0x7c,1);
  auVar6 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])(out + 1) = auVar6;
  auVar1 = vpand_avx(auVar5,auVar10);
  auVar9 = vpor_avx(auVar5,auVar9);
  auVar1 = vpblendd_avx2(auVar1,auVar9,2);
  *(undefined1 (*) [16])(out + 0x11) = auVar1;
  out[0x15] = uVar4 >> 0x13 & 0x7f;
  out[0x16] = uVar4 >> 0x1a | (uVar3 & 1) << 6;
  out[0x17] = uVar3 >> 1 & 0x7f;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack7_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;
  *out = ((*in) >> 16) % (1U << 7);
  out++;
  *out = ((*in) >> 23) % (1U << 7);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 5)) << (7 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 7);
  out++;
  *out = ((*in) >> 12) % (1U << 7);
  out++;
  *out = ((*in) >> 19) % (1U << 7);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 1)) << (7 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 7);
  out++;

  return in + 1;
}